

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_result_collector.cpp
# Opt level: O2

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 __thiscall
duckdb::PhysicalResultCollector::GetResultCollector
          (PhysicalResultCollector *this,ClientContext *context,PreparedStatementData *data)

{
  bool bVar1;
  undefined8 in_RAX;
  pointer pPVar2;
  PhysicalOperator *pPVar3;
  bool *pbVar4;
  undefined1 auStack_28 [5];
  bool local_23;
  bool local_22;
  bool local_21;
  
  _auStack_28 = in_RAX;
  pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&data->physical_plan);
  pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&pPVar2->root);
  bVar1 = PhysicalPlanGenerator::PreserveInsertionOrder(context,pPVar3);
  if (bVar1) {
    pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&data->physical_plan);
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&pPVar2->root);
    bVar1 = PhysicalPlanGenerator::UseBatchIndex(context,pPVar3);
    if (bVar1) {
      if (data->is_streaming != false) {
        make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalBufferedBatchCollector,duckdb::PreparedStatementData&>
                  ((duckdb *)this,data);
        return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                  )this;
      }
      make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalBatchCollector,duckdb::PreparedStatementData&>
                ((duckdb *)this,data);
      return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
              )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )this;
    }
    if (data->is_streaming == false) {
      pbVar4 = (bool *)(auStack_28 + 4);
      auStack_28 = (undefined1  [5])CONCAT14(0,auStack_28._0_4_);
LAB_018d8d91:
      make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalMaterializedCollector,duckdb::PreparedStatementData&,bool>
                ((duckdb *)this,data,pbVar4);
      return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
              )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )this;
    }
    pbVar4 = (bool *)(auStack_28 + 5);
    _auStack_28 = (uint6)(uint5)auStack_28;
  }
  else {
    if (data->is_streaming != true) {
      pbVar4 = (bool *)(auStack_28 + 6);
      _auStack_28 = CONCAT16(1,_auStack_28);
      goto LAB_018d8d91;
    }
    pbVar4 = (bool *)(auStack_28 + 7);
    _auStack_28 = CONCAT17(1,_auStack_28);
  }
  make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalBufferedCollector,duckdb::PreparedStatementData&,bool>
            ((duckdb *)this,data,pbVar4);
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )this;
}

Assistant:

unique_ptr<PhysicalResultCollector> PhysicalResultCollector::GetResultCollector(ClientContext &context,
                                                                                PreparedStatementData &data) {
	if (!PhysicalPlanGenerator::PreserveInsertionOrder(context, data.physical_plan->Root())) {
		// the plan is not order preserving, so we just use the parallel materialized collector
		if (data.is_streaming) {
			return make_uniq_base<PhysicalResultCollector, PhysicalBufferedCollector>(data, true);
		}
		return make_uniq_base<PhysicalResultCollector, PhysicalMaterializedCollector>(data, true);
	} else if (!PhysicalPlanGenerator::UseBatchIndex(context, data.physical_plan->Root())) {
		// the plan is order preserving, but we cannot use the batch index: use a single-threaded result collector
		if (data.is_streaming) {
			return make_uniq_base<PhysicalResultCollector, PhysicalBufferedCollector>(data, false);
		}
		return make_uniq_base<PhysicalResultCollector, PhysicalMaterializedCollector>(data, false);
	} else {
		// we care about maintaining insertion order and the sources all support batch indexes
		// use a batch collector
		if (data.is_streaming) {
			return make_uniq_base<PhysicalResultCollector, PhysicalBufferedBatchCollector>(data);
		}
		return make_uniq_base<PhysicalResultCollector, PhysicalBatchCollector>(data);
	}
}